

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O3

bool __thiscall
leveldb::anon_unknown_0::BloomFilterPolicy::KeyMayMatch
          (BloomFilterPolicy *this,Slice *key,Slice *bloom_filter)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  bool bVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = bloom_filter->size_;
  if (uVar3 < 2) {
    bVar9 = false;
  }
  else {
    pcVar4 = bloom_filter->data_;
    cVar1 = pcVar4[uVar3 - 1];
    uVar10 = (ulong)cVar1;
    bVar9 = true;
    if (uVar10 < 0x1f) {
      uVar8 = Hash(key->data_,key->size_,0xbc9f1d34);
      if (cVar1 != '\0') {
        uVar6 = uVar8 << 0xf;
        uVar7 = uVar8 >> 0x11;
        do {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar3 * 8 - 8;
          bVar11 = (1 << (SUB161(ZEXT416(uVar8) % auVar5,0) & 7) &
                   (uint)(byte)pcVar4[SUB168(ZEXT416(uVar8) % auVar5,0) >> 3 & 0x1fffffff]) == 0;
          bVar9 = !bVar11;
          if (bVar11) break;
          uVar8 = uVar8 + (uVar6 | uVar7);
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

size_t size() const { return size_; }